

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement_verifier.cpp
# Opt level: O2

bool __thiscall
duckdb::StatementVerifier::Run
          (StatementVerifier *this,ClientContext *context,string *query,
          function<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>)>
          *run)

{
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> _Var1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  pointer this_00;
  SelectStatement *local_b0;
  _Any_data local_a8 [8];
  
  LOCK();
  (context->interrupted)._M_base._M_i = false;
  UNLOCK();
  iVar4 = (*this->_vptr_StatementVerifier[4])();
  (context->config).enable_optimizer = (bool)((byte)iVar4 ^ 1);
  iVar4 = (*this->_vptr_StatementVerifier[5])(this);
  (context->config).enable_caching_operators = (bool)((byte)iVar4 ^ 1);
  iVar4 = (*this->_vptr_StatementVerifier[6])(this);
  (context->config).force_external = SUB41(iVar4,0);
  iVar4 = (*this->_vptr_StatementVerifier[7])(this);
  (context->config).force_fetch_row = SUB41(iVar4,0);
  local_b0 = (this->statement).
             super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
             .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (this->statement).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
  ::std::
  function<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>)>
  ::operator()((function<duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_duckdb::optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>)>
                *)local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)run,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               query,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
                      *)&local_b0);
  if (local_b0 != (SelectStatement *)0x0) {
    (**(code **)((long)(local_b0->super_SQLStatement)._vptr_SQLStatement + 8))();
  }
  local_b0 = (SelectStatement *)0x0;
  this_00 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
            operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)local_a8);
  bVar3 = BaseQueryResult::HasError(&this_00->super_BaseQueryResult);
  uVar2 = local_a8[0]._M_unused._0_8_;
  local_a8[0]._M_unused._M_object = (long *)0x0;
  _Var1._M_head_impl =
       (this->materialized_result).
       super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
       .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl;
  (this->materialized_result).
  super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
  .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl =
       (MaterializedQueryResult *)uVar2;
  if (_Var1._M_head_impl != (MaterializedQueryResult *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_QueryResult + 8))();
    if ((long *)local_a8[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_a8[0]._0_8_ + 8))();
    }
  }
  LOCK();
  (context->interrupted)._M_base._M_i = false;
  UNLOCK();
  return bVar3;
}

Assistant:

bool StatementVerifier::Run(
    ClientContext &context, const string &query,
    const std::function<unique_ptr<QueryResult>(const string &, unique_ptr<SQLStatement>,
                                                optional_ptr<case_insensitive_map_t<BoundParameterData>>)> &run) {
	bool failed = false;

	context.interrupted = false;
	context.config.enable_optimizer = !DisableOptimizer();
	context.config.enable_caching_operators = !DisableOperatorCaching();
	context.config.force_external = ForceExternal();
	context.config.force_fetch_row = ForceFetchRow();
	try {
		auto result = run(query, std::move(statement), parameters);
		if (result->HasError()) {
			failed = true;
		}
		materialized_result = unique_ptr_cast<QueryResult, MaterializedQueryResult>(std::move(result));
	} catch (std::exception &ex) {
		failed = true;
		materialized_result = make_uniq<MaterializedQueryResult>(ErrorData(ex));
	}
	context.interrupted = false;

	return failed;
}